

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_fe_mul(void)

{
  secp256k1_fe d;
  secp256k1_fe c;
  secp256k1_fe b;
  secp256k1_fe a;
  int i;
  int in_stack_000000d4;
  secp256k1_fe *in_stack_000000d8;
  secp256k1_fe *in_stack_000000e0;
  secp256k1_fe *in_stack_ffffffffffffff50;
  secp256k1_fe *in_stack_ffffffffffffff70;
  undefined4 local_4;
  
  for (local_4 = 0; SBORROW4(local_4,COUNT * 100) != local_4 + COUNT * -100 < 0;
      local_4 = local_4 + 1) {
    random_fe(in_stack_ffffffffffffff50);
    random_field_element_magnitude(in_stack_ffffffffffffff70);
    random_fe(in_stack_ffffffffffffff50);
    random_field_element_magnitude(in_stack_ffffffffffffff70);
    random_fe_test(in_stack_ffffffffffffff50);
    random_field_element_magnitude(in_stack_ffffffffffffff70);
    random_fe_test(in_stack_ffffffffffffff50);
    random_field_element_magnitude(in_stack_ffffffffffffff70);
    test_fe_mul(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4);
    test_fe_mul(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4);
    test_fe_mul(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4);
    test_fe_mul(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4);
    test_fe_mul(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4);
    test_fe_mul(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4);
  }
  return;
}

Assistant:

static void run_fe_mul(void) {
    int i;
    for (i = 0; i < 100 * COUNT; ++i) {
        secp256k1_fe a, b, c, d;
        random_fe(&a);
        random_field_element_magnitude(&a);
        random_fe(&b);
        random_field_element_magnitude(&b);
        random_fe_test(&c);
        random_field_element_magnitude(&c);
        random_fe_test(&d);
        random_field_element_magnitude(&d);
        test_fe_mul(&a, &a, 1);
        test_fe_mul(&c, &c, 1);
        test_fe_mul(&a, &b, 0);
        test_fe_mul(&a, &c, 0);
        test_fe_mul(&c, &b, 0);
        test_fe_mul(&c, &d, 0);
    }
}